

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O0

void GPU_SetRendererOrder(int order_size,GPU_RendererID *order)

{
  undefined1 local_118 [8];
  GPU_RendererID default_order [10];
  int local_1c;
  GPU_RendererID *pGStack_18;
  int count;
  GPU_RendererID *order_local;
  int order_size_local;
  
  pGStack_18 = order;
  order_local._4_4_ = order_size;
  if (order == (GPU_RendererID *)0x0) {
    local_1c = 0;
    GPU_GetDefaultRendererOrder(&local_1c,(GPU_RendererID *)local_118);
    GPU_SetRendererOrder(local_1c,(GPU_RendererID *)local_118);
  }
  else if (0 < order_size) {
    if (10 < order_size) {
      GPU_PushErrorCode("GPU_SetRendererOrder",GPU_ERROR_USER_ERROR,
                        "Given order_size (%d) is greater than GPU_RENDERER_ORDER_MAX (%d)",
                        (ulong)(uint)order_size,10);
      order_local._4_4_ = 10;
    }
    memcpy(_gpu_renderer_order,pGStack_18,(long)order_local._4_4_ * 0x18);
    _gpu_renderer_order_size = order_local._4_4_;
  }
  return;
}

Assistant:

void GPU_SetRendererOrder(int order_size, GPU_RendererID* order)
{
    if(order == NULL)
    {
        // Restore the default order
        int count = 0;
        GPU_RendererID default_order[GPU_RENDERER_ORDER_MAX];
        GPU_GetDefaultRendererOrder(&count, default_order);
        GPU_SetRendererOrder(count, default_order);  // Call us again with the default order
        return;
    }
    
    if(order_size <= 0)
        return;
    
    if(order_size > GPU_RENDERER_ORDER_MAX)
    {
        GPU_PushErrorCode(__func__, GPU_ERROR_USER_ERROR, "Given order_size (%d) is greater than GPU_RENDERER_ORDER_MAX (%d)", order_size, GPU_RENDERER_ORDER_MAX);
        order_size = GPU_RENDERER_ORDER_MAX;
    }
    
    memcpy(_gpu_renderer_order, order, order_size*sizeof(GPU_RendererID));
    _gpu_renderer_order_size = order_size;
}